

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketConnection.cpp
# Opt level: O0

bool __thiscall
FIX::ThreadedSocketConnection::setSession(ThreadedSocketConnection *this,string *msg)

{
  Log *pLVar1;
  bool bVar2;
  Session *pSVar3;
  SessionID *pSVar4;
  _Self local_1d0;
  _Self local_1c8;
  undefined4 local_1c0;
  int local_1bc;
  undefined1 local_1b8 [4];
  int i;
  SessionID sessionID;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *msg_local;
  ThreadedSocketConnection *this_local;
  
  local_20 = msg;
  msg_local = (string *)this;
  pSVar3 = Session::lookupSession(msg,true);
  this->m_pSession = pSVar3;
  if (this->m_pSession == (Session *)0x0) {
    if (this->m_pLog != (Log *)0x0) {
      pLVar1 = this->m_pLog;
      std::operator+(&local_40,"Session not found for incoming message: ",local_20);
      (*pLVar1->_vptr_Log[6])(pLVar1,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      (*this->m_pLog->_vptr_Log[4])(this->m_pLog,local_20);
    }
    this_local._7_1_ = 0;
  }
  else {
    pSVar4 = Session::getSessionID(this->m_pSession);
    SessionID::SessionID((SessionID *)local_1b8,pSVar4);
    this->m_pSession = (Session *)0x0;
    for (local_1bc = 1; local_1bc < 6; local_1bc = local_1bc + 1) {
      bVar2 = Session::isSessionRegistered((SessionID *)local_1b8);
      if (!bVar2) {
        pSVar3 = Session::registerSession((SessionID *)local_1b8);
        this->m_pSession = pSVar3;
      }
      if (this->m_pSession != (Session *)0x0) break;
      process_sleep(1.0);
    }
    if (this->m_pSession == (Session *)0x0) {
      this_local._7_1_ = 0;
    }
    else {
      pSVar4 = Session::getSessionID(this->m_pSession);
      local_1c8._M_node =
           (_Base_ptr)
           std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::
           find(&this->m_sessions,pSVar4);
      local_1d0._M_node =
           (_Base_ptr)
           std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::end
                     (&this->m_sessions);
      bVar2 = std::operator==(&local_1c8,&local_1d0);
      if (bVar2) {
        this_local._7_1_ = 0;
      }
      else {
        Session::setResponder(this->m_pSession,&this->super_Responder);
        this_local._7_1_ = 1;
      }
    }
    local_1c0 = 1;
    SessionID::~SessionID((SessionID *)local_1b8);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ThreadedSocketConnection::setSession( const std::string& msg )
{
  m_pSession = Session::lookupSession( msg, true );
  if ( !m_pSession ) 
  {
    if( m_pLog )
    {
      m_pLog->onEvent( "Session not found for incoming message: " + msg );
      m_pLog->onIncoming( msg );
    }
    return false;
  }

  SessionID sessionID = m_pSession->getSessionID();
  m_pSession = 0;

  // see if the session frees up within 5 seconds
  for( int i = 1; i <= 5; i++ )
  {
    if( !Session::isSessionRegistered( sessionID ) )
      m_pSession = Session::registerSession( sessionID );
    if( m_pSession ) break;
    process_sleep( 1 );
  }

  if ( !m_pSession ) 
    return false;
  if ( m_sessions.find(m_pSession->getSessionID()) == m_sessions.end() )
    return false;

  m_pSession->setResponder( this );
  return true;
}